

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O0

int convolve(char *type,char *method,double *inp1,int N,double *inp2,int L,double *oup)

{
  int iVar1;
  double *oup_00;
  conv_object obj;
  int local_68;
  int local_64;
  conv_object conv;
  double *oup2;
  int local_48;
  int i;
  int pad;
  int start;
  int LS;
  int LB;
  int M;
  int L_local;
  double *inp2_local;
  int N_local;
  double *inp1_local;
  char *method_local;
  char *type_local;
  
  local_48 = N + L + -1;
  local_64 = L;
  if (L <= N) {
    local_64 = N;
  }
  local_68 = N;
  if (local_64 == N) {
    local_68 = L;
  }
  oup_00 = (double *)malloc((long)local_48 << 3);
  iVar1 = strcmp(method,"direct");
  if ((iVar1 == 0) || (method == (char *)0x0)) {
    conv_direct(inp1,N,inp2,L,oup_00);
  }
  else {
    iVar1 = strcmp(method,"fft");
    if (iVar1 != 0) {
      printf("method - \'direct\' or \'fft\' \n");
      exit(-1);
    }
    obj = conv_init(N,L);
    conv_fft(obj,inp1,inp2,oup_00);
    free_conv(obj);
  }
  iVar1 = strcmp(type,"full");
  if ((iVar1 == 0) || (type == (char *)0x0)) {
    i = 0;
  }
  else {
    iVar1 = strcmp(type,"same");
    if (iVar1 == 0) {
      i = (local_48 - local_64) / 2;
      local_48 = local_64;
    }
    else {
      iVar1 = strcmp(type,"valid");
      if (iVar1 != 0) {
        printf("type - One of \'full\', \'same\' or \'valid\' \n");
        exit(-1);
      }
      i = local_68 + -1;
      if (local_68 == 0) {
        local_48 = local_64;
      }
      else {
        local_48 = (local_64 - local_68) + 1;
      }
    }
  }
  memcpy(oup,oup_00 + i,(long)local_48 << 3);
  free(oup_00);
  return local_48;
}

Assistant:

int convolve(const char *type, const char *method, fft_type *inp1, int N, fft_type *inp2, int L, fft_type *oup) {
	/*

	method - 'direct' or 'fft'
	type - One of 'full', 'same' or 'valid'
	inp1 - First vector of length N
	inp2 - Second vector of length L
	oup2 - Output vector of :

	length N+L-1, if type is 'full'
	length max(N,L), if type is 'same'
	length max(N,L), - min(N,L) + 1 if type is valid

	*/
	int M, LB, LS, start, pad, i;
	fft_type *oup2;
	conv_object conv;

	M = N + L - 1;

	LB = N >= L ? N : L;
	LS = LB == N ? L : N;

	oup2 = (fft_type*)malloc(sizeof(fft_type)*M);

	pad = 0;

	if (!strcmp(method, "direct") || method == NULL) {

		conv_direct(inp1, N, inp2, L, oup2);

	}
	else if (!strcmp(method, "fft")) {

		conv = conv_init(N, L);

		conv_fft(conv, inp1, inp2, oup2);

		free_conv(conv);
	}
	else {
		printf("method - 'direct' or 'fft' \n");
		exit(-1);
	}


	if (!strcmp(type, "full") || type == NULL) {

		start = 0;

		pad = M;

	}
	else  if (!strcmp(type, "same")) {

		start = (M - LB) / 2;

		pad = LB;

	}
	else  if (!strcmp(type, "valid")) {

		start = LS - 1;

		if (LS == 0) {
			pad = LB;
		}
		else {
			pad = LB - LS + 1;
		}

	}
	else {
		printf("type - One of 'full', 'same' or 'valid' \n");
		exit(-1);
	}

	memcpy(oup, oup2 + start, sizeof(fft_type) * pad);


	free(oup2);

	return pad;
}